

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O1

DdNode * Cudd_Xgty(DdManager *dd,int N,DdNode **z,DdNode **x,DdNode **y)

{
  int *piVar1;
  bool bVar2;
  DdNode *g;
  DdNode *n;
  DdNode *h;
  long lVar3;
  long lVar4;
  
  g = Cudd_bddAnd(dd,x[(long)N + -1],(DdNode *)((ulong)y[(long)N + -1] ^ 1));
  if (g == (DdNode *)0x0) {
LAB_00788173:
    g = (DdNode *)0x0;
  }
  else {
    piVar1 = (int *)(((ulong)g & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    if (1 < N) {
      lVar3 = (ulong)(N - 2) + 1;
      do {
        n = Cudd_bddAnd(dd,y[lVar3 + -1],(DdNode *)((ulong)g ^ 1));
        if (n == (DdNode *)0x0) {
LAB_0078816e:
          Cudd_RecursiveDeref(dd,g);
          goto LAB_00788173;
        }
        piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        h = Cudd_bddAnd(dd,(DdNode *)((ulong)y[lVar3 + -1] ^ 1),g);
        if (h == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,g);
          g = n;
          goto LAB_0078816e;
        }
        piVar1 = (int *)(((ulong)h & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,g);
        g = Cudd_bddIte(dd,x[lVar3 + -1],(DdNode *)((ulong)n ^ 1),h);
        if (g == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,n);
          g = h;
          goto LAB_0078816e;
        }
        piVar1 = (int *)(((ulong)g & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,n);
        Cudd_RecursiveDeref(dd,h);
        lVar4 = lVar3 + -1;
        bVar2 = 0 < lVar3;
        lVar3 = lVar4;
      } while (lVar4 != 0 && bVar2);
    }
    piVar1 = (int *)(((ulong)g & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + -1;
  }
  return g;
}

Assistant:

DdNode *
Cudd_Xgty(
  DdManager * dd /* DD manager */,
  int  N /* number of x and y variables */,
  DdNode ** z /* array of z variables: unused */,
  DdNode ** x /* array of x variables */,
  DdNode ** y /* array of y variables */)
{
    DdNode *u, *v, *w;
    int     i;

    /* Build bottom part of BDD outside loop. */
    u = Cudd_bddAnd(dd, x[N-1], Cudd_Not(y[N-1]));
    if (u == NULL) return(NULL);
    cuddRef(u);

    /* Loop to build the rest of the BDD. */
    for (i = N-2; i >= 0; i--) {
        v = Cudd_bddAnd(dd, y[i], Cudd_Not(u));
        if (v == NULL) {
            Cudd_RecursiveDeref(dd, u);
            return(NULL);
        }
        cuddRef(v);
        w = Cudd_bddAnd(dd, Cudd_Not(y[i]), u);
        if (w == NULL) {
            Cudd_RecursiveDeref(dd, u);
            Cudd_RecursiveDeref(dd, v);
            return(NULL);
        }
        cuddRef(w);
        Cudd_RecursiveDeref(dd, u);
        u = Cudd_bddIte(dd, x[i], Cudd_Not(v), w);
        if (u == NULL) {
            Cudd_RecursiveDeref(dd, v);
            Cudd_RecursiveDeref(dd, w);
            return(NULL);
        }
        cuddRef(u);
        Cudd_RecursiveDeref(dd, v);
        Cudd_RecursiveDeref(dd, w);

    }
    cuddDeref(u);
    return(u);

}